

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O0

void __thiscall Test<Imf_3_4::Header>::testFind(Test<Imf_3_4::Header> *this,string *name)

{
  bool bVar1;
  ConstIterator *this_00;
  Iterator iterator;
  Header header;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  ConstIterator *in_stack_ffffffffffffff60;
  Vec2<float> local_50;
  Header local_48 [72];
  
  Imath_3_2::Vec2<float>::Vec2(&local_50,0.0,0.0);
  Imf_3_4::Header::Header(local_48,0x40,0x40,1.0,(Vec2 *)&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_4::Header::find((string *)local_48);
  Imf_3_4::Header::ConstIterator::ConstIterator
            (in_stack_ffffffffffffff60,
             (Iterator *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  this_00 = (ConstIterator *)Imf_3_4::Header::end();
  Imf_3_4::Header::ConstIterator::ConstIterator
            (this_00,(Iterator *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  bVar1 = Imf_3_4::operator!=(this_00,(ConstIterator *)
                                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58))
  ;
  if (!bVar1) {
    __assert_fail("iterator != header.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                  ,0x1e,
                  "void Test<Imf_3_4::Header>::testFind(const string &) [Header = Imf_3_4::Header]")
    ;
  }
  Imf_3_4::Header::~Header(local_48);
  return;
}

Assistant:

void testFind (const string& name)
    {
        Header header;
        auto   iterator = header.find (name);
        assert (iterator != header.end ());
    }